

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyTypeUrl
          (ParserImpl *this,string *full_type_name,string *prefix)

{
  bool bVar1;
  bool bVar2;
  string url3;
  string url2;
  string url1;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_c0.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  bVar1 = ConsumeIdentifier(this,&local_a0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_120,".",(allocator *)&local_100);
    bVar1 = Consume(this,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    if (bVar1) {
      bVar1 = ConsumeIdentifier(this,&local_c0);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_120,".",(allocator *)&local_100);
        bVar1 = Consume(this,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        if (bVar1) {
          bVar1 = ConsumeIdentifier(this,&local_e0);
          if (bVar1) {
            std::__cxx11::string::string((string *)&local_120,"/",(allocator *)&local_100);
            bVar1 = Consume(this,&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            if (bVar1) {
              bVar1 = ConsumeFullTypeName(this,full_type_name);
              if (bVar1) {
                std::operator+(&local_80,&local_a0,".");
                std::operator+(&local_60,&local_80,&local_c0);
                std::operator+(&local_40,&local_60,".");
                std::operator+(&local_100,&local_40,&local_e0);
                std::operator+(&local_120,&local_100,"/");
                std::__cxx11::string::operator=((string *)prefix,(string *)&local_120);
                std::__cxx11::string::~string((string *)&local_120);
                std::__cxx11::string::~string((string *)&local_100);
                std::__cxx11::string::~string((string *)&local_40);
                std::__cxx11::string::~string((string *)&local_60);
                std::__cxx11::string::~string((string *)&local_80);
                bVar1 = std::operator!=(prefix,"type.googleapis.com/");
                bVar2 = true;
                if (!bVar1) goto LAB_0032f233;
                bVar1 = std::operator!=(prefix,"type.googleprod.com/");
                if (!bVar1) goto LAB_0032f233;
                std::operator+(&local_100,
                               "TextFormat::Parser for Any supports only type.googleapis.com and type.googleprod.com, but found \""
                               ,prefix);
                std::operator+(&local_120,&local_100,"\"");
                ReportError(this,&local_120);
                std::__cxx11::string::~string((string *)&local_120);
                std::__cxx11::string::~string((string *)&local_100);
              }
            }
          }
        }
      }
    }
  }
  bVar2 = false;
LAB_0032f233:
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  return bVar2;
}

Assistant:

bool ConsumeAnyTypeUrl(string* full_type_name, string* prefix) {
    // TODO(saito) Extend Consume() to consume multiple tokens at once, so that
    // this code can be written as just DO(Consume(kGoogleApisTypePrefix)).
    string url1, url2, url3;
    DO(ConsumeIdentifier(&url1));  // type
    DO(Consume("."));
    DO(ConsumeIdentifier(&url2));  // googleapis
    DO(Consume("."));
    DO(ConsumeIdentifier(&url3));  // com
    DO(Consume("/"));
    DO(ConsumeFullTypeName(full_type_name));

    *prefix = url1 + "." + url2 + "." + url3 + "/";
    if (*prefix != internal::kTypeGoogleApisComPrefix &&
        *prefix != internal::kTypeGoogleProdComPrefix) {
      ReportError("TextFormat::Parser for Any supports only "
                  "type.googleapis.com and type.googleprod.com, "
                  "but found \"" + *prefix + "\"");
      return false;
    }
    return true;
  }